

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_method.c
# Opt level: O0

value method_metadata(method_conflict m)

{
  value pvVar1;
  value pvVar2;
  value pvVar3;
  value pvVar4;
  value pvVar5;
  value *ppvVar6;
  value *m_map;
  value metatada;
  value visibility;
  value async;
  value sig;
  value name;
  size_t in_stack_ffffffffffffffb8;
  value *in_stack_ffffffffffffffc0;
  method_conflict in_stack_ffffffffffffffc8;
  
  pvVar1 = method_metadata_name(in_stack_ffffffffffffffc8);
  if (pvVar1 != (value)0x0) {
    pvVar2 = method_metadata_signature(in_stack_ffffffffffffffc8);
    if (pvVar2 != (value)0x0) {
      pvVar3 = method_metadata_async(in_stack_ffffffffffffffc8);
      if (pvVar3 != (value)0x0) {
        pvVar4 = method_metadata_visibility((method_conflict)0x108eb7);
        if (pvVar4 != (value)0x0) {
          pvVar5 = value_create_map(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          if (pvVar5 != (value)0x0) {
            ppvVar6 = value_to_map((value)0x108eed);
            *ppvVar6 = pvVar1;
            ppvVar6[1] = pvVar2;
            ppvVar6[2] = pvVar3;
            ppvVar6[3] = pvVar4;
            return pvVar5;
          }
          value_type_destroy(name);
        }
        value_type_destroy(name);
      }
      value_type_destroy(name);
    }
    value_type_destroy(name);
  }
  return (value)0x0;
}

Assistant:

value method_metadata(method m)
{
	value name, sig, async, visibility, metatada;
	value *m_map;

	/* Create method name array */
	name = method_metadata_name(m);

	if (name == NULL)
	{
		goto error_name;
	}

	/* Create signature array */
	sig = method_metadata_signature(m);

	if (sig == NULL)
	{
		goto error_signature;
	}

	/* Create method async array */
	async = method_metadata_async(m);

	if (async == NULL)
	{
		goto error_async;
	}

	/* Create method visibility array */
	visibility = method_metadata_visibility(m);

	if (visibility == NULL)
	{
		goto error_visibility;
	}

	/* Create method map (name + signature + async + visibility) */
	metatada = value_create_map(NULL, 4);

	if (metatada == NULL)
	{
		goto error_method;
	}

	m_map = value_to_map(metatada);

	m_map[0] = name;
	m_map[1] = sig;
	m_map[2] = async;
	m_map[3] = visibility;

	return metatada;

error_method:
	value_type_destroy(visibility);
error_visibility:
	value_type_destroy(async);
error_async:
	value_type_destroy(sig);
error_signature:
	value_type_destroy(name);
error_name:
	return NULL;
}